

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O3

void __thiscall gui::TextBox::draw(TextBox *this,RenderTarget *target,RenderStates states)

{
  element_type *peVar1;
  bool bVar2;
  Transform *right;
  long lVar3;
  String local_50;
  
  bVar2 = Widget::isVisible(&this->super_Widget);
  if (!bVar2) {
    return;
  }
  right = Widget::getTransform(&this->super_Widget);
  sf::operator*=(&states.transform,right);
  sf::RectangleShape::setSize
            (&((this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->box_,&this->size_);
  peVar1 = (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sf::Shape::setFillColor(&(peVar1->box_).super_Shape,&peVar1->boxColor_ + this->readOnly_);
  sf::RenderTarget::draw
            (target,(Drawable *)
                    &((this->style_).
                      super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     box_,&states);
  bVar2 = sf::String::isEmpty(&this->boxString_);
  if (bVar2) {
    bVar2 = sf::String::isEmpty(&this->defaultString_);
    if ((!bVar2) &&
       ((bVar2 = Widget::isFocused(&this->super_Widget), !bVar2 || (this->readOnly_ == true)))) {
      peVar1 = (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      sf::String::substring(&local_50,&this->defaultString_,0,this->widthCharacters_);
      sf::Text::setString(&peVar1->text_,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)local_50.m_string._M_dataplus._M_p != &local_50.m_string.field_2) {
        operator_delete(local_50.m_string._M_dataplus._M_p);
      }
      lVar3 = 0x43c;
      goto LAB_00158cf0;
    }
  }
  sf::Text::setString(&((this->style_).
                        super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       text_,&this->visibleString_);
  lVar3 = 0x438;
LAB_00158cf0:
  peVar1 = (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sf::Text::setFillColor
            (&peVar1->text_,
             (Color *)((long)(peVar1->box_).super_Shape.super_Transformable.m_transform.m_matrix +
                      lVar3 + 0xffffffffffffffc4U));
  if (this->readOnly_ == true) {
    peVar1 = (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    sf::Text::setFillColor(&peVar1->text_,&peVar1->defaultTextColor_);
  }
  peVar1 = (this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  sf::Transformable::setPosition
            (&(peVar1->text_).super_Transformable,(peVar1->textPadding_).x,(peVar1->textPadding_).y)
  ;
  sf::RenderTarget::draw
            (target,&(((this->style_).
                       super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     text_).super_Drawable,&states);
  bVar2 = Widget::isFocused(&this->super_Widget);
  if ((bVar2) && (this->readOnly_ == false)) {
    sf::Transformable::setPosition
              (&(((this->style_).super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->caret_).super_Shape.super_Transformable,&this->caretDrawPosition_);
    sf::RenderTarget::draw
              (target,(Drawable *)
                      &((this->style_).
                        super___shared_ptr<gui::TextBoxStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       caret_,&states);
  }
  return;
}

Assistant:

void TextBox::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    style_->box_.setSize(size_);
    style_->box_.setFillColor(readOnly_ ? style_->readOnlyBoxColor_ : style_->boxColor_);
    target.draw(style_->box_, states);
    if (boxString_.isEmpty() && !defaultString_.isEmpty() && (!isFocused() || readOnly_)) {
        style_->text_.setString(defaultString_.substring(0, widthCharacters_));
        style_->text_.setFillColor(style_->defaultTextColor_);
    } else {
        style_->text_.setString(visibleString_);
        style_->text_.setFillColor(style_->textColor_);
    }
    if (readOnly_) {
        style_->text_.setFillColor(style_->defaultTextColor_);
    }
    style_->text_.setPosition(style_->textPadding_.x, style_->textPadding_.y);
    target.draw(style_->text_, states);
    if (isFocused() && !readOnly_) {
        style_->caret_.setPosition(caretDrawPosition_);
        target.draw(style_->caret_, states);
    }
}